

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckCloseFailureBecauseOfExceptionContainsCorrectDetails::
TestCheckCloseFailureBecauseOfExceptionContainsCorrectDetails
          (TestCheckCloseFailureBecauseOfExceptionContainsCorrectDetails *this)

{
  char *suiteName;
  TestCheckCloseFailureBecauseOfExceptionContainsCorrectDetails *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"CheckCloseFailureBecauseOfExceptionContainsCorrectDetails",suiteName
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestCheckMacros.cpp"
             ,0x115);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestCheckCloseFailureBecauseOfExceptionContainsCorrectDetails_00183080;
  return;
}

Assistant:

TEST(CheckCloseFailureBecauseOfExceptionContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("closeTest", "closeSuite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);
        CHECK_CLOSE ((float)ThrowingFunction(), 1.0001f, 0.1f);    line = __LINE__;
    }

    CHECK_EQUAL("closeTest", reporter.lastFailedTest);
    CHECK_EQUAL("closeSuite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}